

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagPrinterFancyUnix.cpp
# Opt level: O0

void __thiscall Mond::DiagPrinterFancy::SetColor(DiagPrinterFancy *this,Severity s)

{
  Severity s_local;
  DiagPrinterFancy *this_local;
  
  if (s == Info) {
    printf("\x1b[1;36m");
  }
  else if (s == Warning) {
    printf("\x1b[1;33m");
  }
  else if (s == Error) {
    printf("\x1b[1;31m");
  }
  return;
}

Assistant:

void DiagPrinterFancy::SetColor(Severity s)
{
	switch (s) {
	case Info:
		printf("\x1B[1;36m");
		break;
	case Warning:
		printf("\x1B[1;33m");
		break;
	case Error:
		printf("\x1B[1;31m");
		break;
	}
}